

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QFixed>::clear(QList<QFixed> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QPodArrayOps<QFixed> *this_00;
  __off_t __length;
  QArrayDataPointer<QFixed> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QFixed> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  undefined1 *n;
  undefined1 *alloc;
  QArrayDataPointer<QFixed> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<QFixed> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<QFixed>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<QFixed>::needsDetach(in_RDI);
    if (bVar2) {
      n = &DAT_aaaaaaaaaaaaaaaa;
      alloc = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (QArrayDataPointer<QFixed> *)&DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<QFixed>::allocatedCapacity(in_RDI);
      QArrayDataPointer<QFixed>::QArrayDataPointer(pQVar4,(qsizetype)alloc,(qsizetype)n,option);
      QArrayDataPointer<QFixed>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<QFixed>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QPodArrayOps<QFixed> *)QArrayDataPointer<QFixed>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<QFixed>::truncate(this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }